

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O2

void P_SetLineID(int i,line_t *ld)

{
  int iVar1;
  
  if (level.maptype != MAPTYPE_HEXEN) {
    return;
  }
  iVar1 = ld->special;
  if (iVar1 == 1) {
    iVar1 = ld->args[3];
  }
  else if (iVar1 == 5) {
    iVar1 = ld->args[4];
  }
  else {
    if (iVar1 != 0xde) {
      if (iVar1 == 0x9c) {
        iVar1 = ld->args[1];
        goto LAB_004d04ea;
      }
      if (iVar1 == 0xb5) {
        if ((ib_compatflags._1_1_ & 2) != 0) {
          return;
        }
        iVar1 = ld->args[2];
        goto LAB_004d04ea;
      }
      if (iVar1 == 0xbe) {
        if (ld->args[1] != 3) {
          return;
        }
      }
      else {
        if (iVar1 == 0xd0) {
          iVar1 = ld->args[0];
          ld->flags = ld->flags | ld->args[3] << 0x10;
          goto LAB_004d04ea;
        }
        if (iVar1 != 0xd7) {
          if (iVar1 != 0x79) {
            return;
          }
          iVar1 = ld->args[0];
          if ((level.flags2._2_1_ & 0x80) == 0) {
            iVar1 = iVar1 + ld->args[4] * 0x100;
            ld->flags = ld->flags | ld->args[1] << 0x10;
          }
          ld->special = 0;
          goto LAB_004d04ea;
        }
      }
    }
    iVar1 = ld->args[0];
  }
LAB_004d04ea:
  if (iVar1 == -1) {
    return;
  }
  FTagManager::AddLineID(&tagManager,i,iVar1);
  return;
}

Assistant:

void P_SetLineID (int i, line_t *ld)
{
	// [RH] Set line id (as appropriate) here
	// for Doom format maps this must be done in P_TranslateLineDef because
	// the tag doesn't always go into the first arg.
	if (level.maptype == MAPTYPE_HEXEN)	
	{
		int setid = -1;
		switch (ld->special)
		{
		case Line_SetIdentification:
			if (!(level.flags2 & LEVEL2_HEXENHACK))
			{
				setid = ld->args[0] + 256 * ld->args[4];
				ld->flags |= ld->args[1]<<16;
			}
			else
			{
				setid = ld->args[0];
			}
			ld->special = 0;
			break;

		case TranslucentLine:
			setid = ld->args[0];
			ld->flags |= ld->args[3]<<16;
			break;

		case Teleport_Line:
		case Scroll_Texture_Model:
			setid = ld->args[0];
			break;

		case Polyobj_StartLine:
			setid = ld->args[3];
			break;

		case Polyobj_ExplicitLine:
			setid = ld->args[4];
			break;
			
		case Plane_Align:
			if (!(ib_compatflags & BCOMPATF_NOSLOPEID)) setid = ld->args[2];
			break;
			
		case Static_Init:
			if (ld->args[1] == Init_SectorLink) setid = ld->args[0];
			break;

		case Line_SetPortal:
			setid = ld->args[1]; // 0 = target id, 1 = this id, 2 = plane anchor
			break;
		}
		if (setid != -1)
		{
			tagManager.AddLineID(i, setid);
		}
	}
}